

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.hpp
# Opt level: O2

void websocketpp::sha1::calc(void *src,size_t bytelength,uchar *hash)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint result [5];
  uint w [80];
  
  result[4] = 0xc3d2e1f0;
  result[0] = 0x67452301;
  result[1] = 0xefcdab89;
  result[2] = 0x98badcfe;
  result[3] = 0x10325476;
  if (bytelength < 0x40) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    while (uVar8 <= bytelength - 0x40) {
      lVar7 = -uVar8;
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
        lVar7 = lVar7 + -4;
        uVar2 = swap_bytes(*(undefined4 *)((long)src + lVar4 * 4 + uVar8));
        w[lVar4] = uVar2;
      }
      anon_unknown_1::innerHash(result,w);
      uVar8 = -lVar7;
    }
  }
  uVar6 = bytelength - uVar8;
  anon_unknown_1::clearWBuffert(w);
  bVar5 = 0;
  for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
    puVar1 = (uint *)((long)w + (uVar3 & 0xfffffffffffffffc));
    *puVar1 = *puVar1 | (uint)*(byte *)((long)src + uVar3 + uVar8) << (~bVar5 & 0x18);
    bVar5 = bVar5 + 8;
  }
  puVar1 = (uint *)((long)w + (uVar6 & 0xfffffffffffffffc));
  *puVar1 = *puVar1 | 0x80 << (~((char)uVar6 * '\b') & 0x18U);
  if (0x37 < uVar6) {
    anon_unknown_1::innerHash(result,w);
    anon_unknown_1::clearWBuffert(w);
  }
  w[0xf] = (int)bytelength << 3;
  anon_unknown_1::innerHash(result,w);
  lVar4 = 0x13;
  for (lVar7 = 0x1e0; lVar7 != 0; lVar7 = lVar7 + -0x18) {
    hash[lVar4] = (uchar)(*(uint *)((long)result + (ulong)((uint)lVar4 & 0xfffffffc)) >>
                         ((byte)lVar7 & 0x18));
    lVar4 = lVar4 + -1;
  }
  return;
}

Assistant:

inline void calc(void const * src, size_t bytelength, unsigned char * hash) {
    // Init the result array.
    unsigned int result[5] = { 0x67452301, 0xefcdab89, 0x98badcfe,
                               0x10325476, 0xc3d2e1f0 };

    // Cast the void src pointer to be the byte array we can work with.
    unsigned char const * sarray = (unsigned char const *) src;

    // The reusable round buffer
    unsigned int w[80];

    // Loop through all complete 64byte blocks.

    size_t endCurrentBlock;
    size_t currentBlock = 0;

    if (bytelength >= 64) {
        size_t const endOfFullBlocks = bytelength - 64;

        while (currentBlock <= endOfFullBlocks) {
            endCurrentBlock = currentBlock + 64;

            // Init the round buffer with the 64 byte block data.
            for (int roundPos = 0; currentBlock < endCurrentBlock; currentBlock += 4)
            {
                // This line will swap endian on big endian and keep endian on
                // little endian.
                w[roundPos++] = (unsigned int) sarray[currentBlock + 3]
                        | (((unsigned int) sarray[currentBlock + 2]) << 8)
                        | (((unsigned int) sarray[currentBlock + 1]) << 16)
                        | (((unsigned int) sarray[currentBlock]) << 24);
            }
            innerHash(result, w);
        }
    }

    // Handle the last and not full 64 byte block if existing.
    endCurrentBlock = bytelength - currentBlock;
    clearWBuffert(w);
    size_t lastBlockBytes = 0;
    for (;lastBlockBytes < endCurrentBlock; ++lastBlockBytes) {
        w[lastBlockBytes >> 2] |= (unsigned int) sarray[lastBlockBytes + currentBlock] << ((3 - (lastBlockBytes & 3)) << 3);
    }

    w[lastBlockBytes >> 2] |= 0x80 << ((3 - (lastBlockBytes & 3)) << 3);
    if (endCurrentBlock >= 56) {
        innerHash(result, w);
        clearWBuffert(w);
    }
    w[15] = bytelength << 3;
    innerHash(result, w);

    // Store hash in result pointer, and make sure we get in in the correct
    // order on both endian models.
    for (int hashByte = 20; --hashByte >= 0;) {
        hash[hashByte] = (result[hashByte >> 2] >> (((3 - hashByte) & 0x3) << 3)) & 0xff;
    }
}